

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O1

void __thiscall gss::innards::Proof::create_forbidden_assignment_constraint(Proof *this,int p,int t)

{
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var1;
  mapped_type *pmVar2;
  ostream *poVar3;
  key_type local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             &((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->field_0x50,
             "* forbidden assignment\n",0x17);
  poVar3 = (ostream *)
           &((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->field_0x50;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"1 ~x",4);
  local_40.first = (long)p;
  local_40.second = (long)t;
  pmVar2 = std::
           map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&((this->_imp)._M_t.
                          super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                          .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         variable_mappings,&local_40);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," >= 1 ;\n",8);
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  (_Var1._M_head_impl)->nb_constraints = (_Var1._M_head_impl)->nb_constraints + 1;
  local_40.first = CONCAT44(t,p);
  std::
  _Rb_tree<std::pair<long,long>,std::pair<std::pair<long,long>const,long>,std::_Select1st<std::pair<std::pair<long,long>const,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<std::pair<long,long>const,long>>>
  ::_M_emplace_unique<std::pair<int,int>,long&>
            ((_Rb_tree<std::pair<long,long>,std::pair<std::pair<long,long>const,long>,std::_Select1st<std::pair<std::pair<long,long>const,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<std::pair<long,long>const,long>>>
              *)&(_Var1._M_head_impl)->eliminations,(pair<int,_int> *)&local_40,
             &(_Var1._M_head_impl)->nb_constraints);
  return;
}

Assistant:

auto Proof::create_forbidden_assignment_constraint(int p, int t) -> void
{
    _imp->model_stream << "* forbidden assignment\n";
    _imp->model_stream << "1 ~x" << _imp->variable_mappings[pair{p, t}] << " >= 1 ;\n";
    ++_imp->nb_constraints;
    _imp->eliminations.emplace(pair{p, t}, _imp->nb_constraints);
}